

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall cmTarget::ComputeOutputDir(cmTarget *this,string *config,bool implib,string *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  cmMakefile *pcVar4;
  char *pcVar5;
  cmGlobalGenerator *pcVar6;
  char *pcVar7;
  long *plVar8;
  char *pcVar9;
  long *plVar10;
  string suffix;
  size_type __dnew;
  string configPropStr;
  string propertyNameStr;
  string conf;
  string targetTypeName;
  string configUpper;
  string local_110;
  undefined2 *local_f0;
  undefined8 local_e8;
  undefined2 local_e0;
  undefined6 uStack_de;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  pcVar2 = (config->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + config->_M_string_length);
  switch(this->TargetTypeValue) {
  case EXECUTABLE:
    pcVar5 = "RUNTIME";
    goto LAB_002a1d2c;
  case STATIC_LIBRARY:
    pcVar5 = "ARCHIVE";
    break;
  case SHARED_LIBRARY:
    pcVar9 = "RUNTIME";
    if (implib) {
      pcVar9 = "ARCHIVE";
    }
    pcVar5 = "LIBRARY";
    if (this->DLLPlatform != false) {
      pcVar5 = pcVar9;
    }
    break;
  case MODULE_LIBRARY:
    pcVar5 = "LIBRARY";
LAB_002a1d2c:
    if (implib) {
      pcVar5 = "ARCHIVE";
    }
    break;
  default:
    pcVar5 = "";
  }
  std::__cxx11::string::string((string *)&local_70,pcVar5,(allocator *)&local_b0);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_70,local_68 + (long)local_70);
  if (local_a8 == 0) {
    plVar10 = (long *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_b0);
    plVar10 = local_b0;
  }
  cmsys::SystemTools::UpperCase(&local_50,&local_90);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_70,local_68 + (long)local_70);
  if (local_c8 == 0) {
    plVar8 = (long *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&local_d0);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_50._M_dataplus._M_p);
    plVar8 = local_d0;
  }
  std::__cxx11::string::string((string *)&local_110,(char *)plVar8,(allocator *)&local_f0);
  pcVar5 = GetProperty(this,&local_110,this->Makefile);
  paVar1 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (pcVar5 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_110,(char *)plVar10,(allocator *)&local_f0);
    pcVar5 = GetProperty(this,&local_110,this->Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (pcVar5 == (char *)0x0) {
      if (this->TargetTypeValue - STATIC_LIBRARY < 3) {
        pcVar4 = this->Makefile;
        local_f0 = (undefined2 *)0x13;
        local_110._M_dataplus._M_p = (pointer)paVar1;
        local_110._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
        local_110.field_2._M_allocated_capacity = (size_type)local_f0;
        *(undefined8 *)local_110._M_dataplus._M_p = 0x5f5952415242494c;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 8) = 'O';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 9) = 'U';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 10) = 'T';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xb) = 'P';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xc) = 'U';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xd) = 'T';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xe) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xf) = 'P';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xf) = 'P';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x10) = 'A';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x11) = 'T';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x12) = 'H';
        local_110._M_string_length = (size_type)local_f0;
        local_110._M_dataplus._M_p[(long)local_f0] = '\0';
        pcVar9 = cmMakefile::GetSafeDefinition(pcVar4,&local_110);
        pcVar5 = (char *)out->_M_string_length;
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)out,0,pcVar5,(ulong)pcVar9);
      }
      else {
        if (this->TargetTypeValue != EXECUTABLE) goto LAB_002a2033;
        pcVar4 = this->Makefile;
        local_f0 = (undefined2 *)0x16;
        local_110._M_dataplus._M_p = (pointer)paVar1;
        local_110._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
        local_110.field_2._M_allocated_capacity = (size_type)local_f0;
        *(undefined8 *)local_110._M_dataplus._M_p = 0x4241545543455845;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 8) = 'L';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 9) = 'E';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 10) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xb) = 'O';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xc) = 'U';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xd) = 'T';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xe) = 'P';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xf) = 'U';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xe) = 'P';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0xf) = 'U';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x10) = 'T';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x11) = '_';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x12) = 'P';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x13) = 'A';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x14) = 'T';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p + 0x15) = 'H';
        local_110._M_string_length = (size_type)local_f0;
        local_110._M_dataplus._M_p[(long)local_f0] = '\0';
        pcVar9 = cmMakefile::GetSafeDefinition(pcVar4,&local_110);
        pcVar5 = (char *)out->_M_string_length;
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)out,0,pcVar5,(ulong)pcVar9);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pcVar9 = (char *)out->_M_string_length;
      strlen(pcVar5);
      std::__cxx11::string::_M_replace((ulong)out,0,pcVar9,(ulong)pcVar5);
    }
  }
  else {
    pcVar9 = (char *)out->_M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar9,(ulong)pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)local_90._M_string_length,0x4f559d);
  }
LAB_002a2033:
  sVar3 = out->_M_string_length;
  if (sVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)out,0,(char *)0x0,0x4b8777);
  }
  pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
  cmsys::SystemTools::CollapseFullPath(&local_110,out,pcVar5);
  std::__cxx11::string::operator=((string *)out,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_90._M_string_length != (char *)0x0) {
    pcVar4 = this->Makefile;
    local_f0 = (undefined2 *)0x1f;
    local_110._M_dataplus._M_p = (pointer)paVar1;
    local_110._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_f0);
    local_110.field_2._M_allocated_capacity = (size_type)local_f0;
    builtin_strncpy(local_110._M_dataplus._M_p,"CMAKE_XCODE_EFFECTIVE_PLATFORMS",0x1f);
    local_110._M_string_length = (size_type)local_f0;
    local_110._M_dataplus._M_p[(long)local_f0] = '\0';
    pcVar5 = cmMakefile::GetDefinition(pcVar4,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    pcVar9 = "";
    if (sVar3 == 0 && pcVar5 != (char *)0x0) {
      pcVar9 = "$(EFFECTIVE_PLATFORM_NAME)";
    }
    pcVar7 = pcVar9 + 0x1a;
    if (sVar3 != 0 || pcVar5 == (char *)0x0) {
      pcVar7 = pcVar9;
    }
    local_110._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,pcVar9,pcVar7);
    pcVar6 = cmMakefile::GetGlobalGenerator(this->Makefile);
    local_e0 = 0x2f;
    local_e8 = 1;
    local_f0 = &local_e0;
    (*pcVar6->_vptr_cmGlobalGenerator[0xe])(pcVar6,&local_f0,&local_90,&local_110,out);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT62(uStack_de,local_e0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return sVar3 == 0;
}

Assistant:

bool cmTarget::ComputeOutputDir(const std::string& config,
                                bool implib, std::string& out) const
{
  bool usesDefaultOutputDir = false;
  std::string conf = config;

  // Look for a target property defining the target output directory
  // based on the target type.
  std::string targetTypeName = this->GetOutputTargetType(implib);
  const char* propertyName = 0;
  std::string propertyNameStr = targetTypeName;
  if(!propertyNameStr.empty())
    {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
    }

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = 0;
  std::string configPropStr = targetTypeName;
  if(!configPropStr.empty())
    {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
    }

  // Select an output directory.
  if(const char* config_outdir = this->GetProperty(configProp))
    {
    // Use the user-specified per-configuration output directory.
    out = config_outdir;

    // Skip per-configuration subdirectory.
    conf = "";
    }
  else if(const char* outdir = this->GetProperty(propertyName))
    {
    // Use the user-specified output directory.
    out = outdir;
    }
  else if(this->GetType() == cmTarget::EXECUTABLE)
    {
    // Lookup the output path for executables.
    out = this->Makefile->GetSafeDefinition("EXECUTABLE_OUTPUT_PATH");
    }
  else if(this->GetType() == cmTarget::STATIC_LIBRARY ||
          this->GetType() == cmTarget::SHARED_LIBRARY ||
          this->GetType() == cmTarget::MODULE_LIBRARY)
    {
    // Lookup the output path for libraries.
    out = this->Makefile->GetSafeDefinition("LIBRARY_OUTPUT_PATH");
    }
  if(out.empty())
    {
    // Default to the current output directory.
    usesDefaultOutputDir = true;
    out = ".";
    }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath
         (out, this->Makefile->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if(!conf.empty())
    {
    const char *platforms = this->Makefile->GetDefinition(
      "CMAKE_XCODE_EFFECTIVE_PLATFORMS");
    std::string suffix =
      usesDefaultOutputDir && platforms ? "$(EFFECTIVE_PLATFORM_NAME)" : "";
    this->Makefile->GetGlobalGenerator()->
      AppendDirectoryForConfig("/", conf, suffix, out);
    }

  return usesDefaultOutputDir;
}